

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Video::~Video(Video *this)

{
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Video_008219e8;
  if (this->content != (uint8_t *)0x0) {
    operator_delete__(this->content);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->props).
              super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->fileName);
  std::__cxx11::string::~string((string *)&this->relativeFileName);
  std::__cxx11::string::~string((string *)&this->type);
  Object::~Object(&this->super_Object);
  return;
}

Assistant:

Video::~Video()
{
    if(content) {
        delete[] content;
    }
}